

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O0

void BrotliSplitBlockLiteralsFromStored
               (MemoryManager *m,Command *cmds,size_t num_commands,size_t pos,size_t mask,
               BlockSplit *literal_split,BlockSplitFromDecoder *literal_split_decoder,
               size_t *cur_block_decoder)

{
  uint32_t uVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  long lVar5;
  uint32_t *local_b0;
  uint32_t *local_a8;
  uint8_t *local_a0;
  uint8_t *local_98;
  int local_90;
  int local_8c;
  int i;
  int i_1;
  int *types_mapping;
  size_t cur_length;
  size_t cur_pos;
  uint32_t *new_array_1;
  size_t _new_size_1;
  uint8_t *new_array;
  size_t _new_size;
  BlockSplit *literal_split_local;
  size_t mask_local;
  size_t pos_local;
  size_t num_commands_local;
  Command *cmds_local;
  MemoryManager *m_local;
  
  if (literal_split->types_alloc_size < literal_split_decoder->num_blocks) {
    if (literal_split->types_alloc_size == 0) {
      local_98 = (uint8_t *)literal_split_decoder->num_blocks;
    }
    else {
      local_98 = (uint8_t *)literal_split->types_alloc_size;
    }
    for (new_array = local_98; new_array < (uint8_t *)literal_split_decoder->num_blocks;
        new_array = (uint8_t *)((long)new_array << 1)) {
    }
    if (new_array == (uint8_t *)0x0) {
      local_a0 = (uint8_t *)0x0;
    }
    else {
      local_a0 = (uint8_t *)BrotliAllocate(m,(size_t)new_array);
    }
    if (literal_split->types_alloc_size != 0) {
      memcpy(local_a0,literal_split->types,literal_split->types_alloc_size);
    }
    BrotliFree(m,literal_split->types);
    literal_split->types = (uint8_t *)0x0;
    literal_split->types = local_a0;
    literal_split->types_alloc_size = (size_t)new_array;
  }
  if (literal_split->lengths_alloc_size < literal_split_decoder->num_blocks) {
    if (literal_split->lengths_alloc_size == 0) {
      local_a8 = (uint32_t *)literal_split_decoder->num_blocks;
    }
    else {
      local_a8 = (uint32_t *)literal_split->lengths_alloc_size;
    }
    for (new_array_1 = local_a8; new_array_1 < (uint32_t *)literal_split_decoder->num_blocks;
        new_array_1 = (uint32_t *)((long)new_array_1 << 1)) {
    }
    if (new_array_1 == (uint32_t *)0x0) {
      local_b0 = (uint32_t *)0x0;
    }
    else {
      local_b0 = (uint32_t *)BrotliAllocate(m,(long)new_array_1 << 2);
    }
    if (literal_split->lengths_alloc_size != 0) {
      memcpy(local_b0,literal_split->lengths,literal_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,literal_split->lengths);
    literal_split->lengths = (uint32_t *)0x0;
    literal_split->lengths = local_b0;
    literal_split->lengths_alloc_size = (size_t)new_array_1;
  }
  literal_split->num_blocks = 0;
  literal_split->num_types = 0;
  types_mapping = (int *)0x0;
  pvVar4 = malloc(literal_split_decoder->num_types << 2);
  for (local_8c = 0; (ulong)(long)local_8c < literal_split_decoder->num_types;
      local_8c = local_8c + 1) {
    *(undefined4 *)((long)pvVar4 + (long)local_8c * 4) = 0xffffffff;
  }
  local_90 = 0;
  cur_length = pos;
  while (uVar1 = (uint32_t)types_mapping, (ulong)(long)local_90 < num_commands) {
    if (literal_split_decoder->positions_end[*cur_block_decoder] <= cur_length) {
      if (types_mapping != (int *)0x0) {
        if (*(int *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4) ==
            -1) {
          *(int *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4) =
               (int)literal_split->num_types;
        }
        if ((literal_split->num_blocks == 0) ||
           (*(uint *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4) !=
            (uint)literal_split->types[literal_split->num_blocks - 1])) {
          literal_split->types[literal_split->num_blocks] =
               (uint8_t)*(undefined4 *)
                         ((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4
                         );
          literal_split->lengths[literal_split->num_blocks] = uVar1;
          bVar2 = (byte)literal_split->num_types;
          bVar3 = literal_split->types[literal_split->num_blocks] + 1;
          if (bVar3 < bVar2) {
            bVar3 = bVar2;
          }
          literal_split->num_types = (ulong)bVar3;
          literal_split->num_blocks = literal_split->num_blocks + 1;
        }
        else {
          lVar5 = literal_split->num_blocks - 1;
          literal_split->lengths[lVar5] = literal_split->lengths[lVar5] + uVar1;
        }
        types_mapping = (int *)0x0;
      }
      *cur_block_decoder = *cur_block_decoder + 1;
    }
    while (literal_split_decoder->positions_end[*cur_block_decoder] <= cur_length) {
      *cur_block_decoder = *cur_block_decoder + 1;
    }
    if (cur_length < literal_split_decoder->positions_begin[*cur_block_decoder]) {
      if ((ulong)literal_split_decoder->positions_end[*cur_block_decoder] <
          cur_length + cmds[local_90].insert_len_) {
        types_mapping =
             (int *)((ulong)(literal_split_decoder->positions_end[*cur_block_decoder] -
                            literal_split_decoder->positions_begin[*cur_block_decoder]) +
                    (long)types_mapping);
        if (types_mapping != (int *)0x0) {
          if (*(int *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4)
              == -1) {
            *(int *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4) =
                 (int)literal_split->num_types;
          }
          if ((literal_split->num_blocks == 0) ||
             (*(uint *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4)
              != (uint)literal_split->types[literal_split->num_blocks - 1])) {
            literal_split->types[literal_split->num_blocks] =
                 (uint8_t)*(undefined4 *)
                           ((long)pvVar4 +
                           (ulong)literal_split_decoder->types[*cur_block_decoder] * 4);
            literal_split->lengths[literal_split->num_blocks] = (uint32_t)types_mapping;
            bVar2 = (byte)literal_split->num_types;
            bVar3 = literal_split->types[literal_split->num_blocks] + 1;
            if (bVar3 < bVar2) {
              bVar3 = bVar2;
            }
            literal_split->num_types = (ulong)bVar3;
            literal_split->num_blocks = literal_split->num_blocks + 1;
          }
          else {
            lVar5 = literal_split->num_blocks - 1;
            literal_split->lengths[lVar5] = literal_split->lengths[lVar5] + (uint32_t)types_mapping;
          }
          types_mapping = (int *)0x0;
        }
        *cur_block_decoder = *cur_block_decoder + 1;
      }
      else {
        types_mapping =
             (int *)(((cur_length + cmds[local_90].insert_len_) -
                     (ulong)literal_split_decoder->positions_begin[*cur_block_decoder]) +
                    (long)types_mapping);
        cur_length = (cmds[local_90].insert_len_ + (cmds[local_90].copy_len_ & 0x1ffffff)) +
                     cur_length;
        local_90 = local_90 + 1;
      }
    }
    else if (cur_length < literal_split_decoder->positions_end[*cur_block_decoder]) {
      if ((ulong)literal_split_decoder->positions_end[*cur_block_decoder] <
          cur_length + cmds[local_90].insert_len_) {
        types_mapping =
             (int *)((literal_split_decoder->positions_end[*cur_block_decoder] - cur_length) +
                    (long)types_mapping);
        if (types_mapping != (int *)0x0) {
          if (*(int *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4)
              == -1) {
            *(int *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4) =
                 (int)literal_split->num_types;
          }
          if ((literal_split->num_blocks == 0) ||
             (*(uint *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4)
              != (uint)literal_split->types[literal_split->num_blocks - 1])) {
            literal_split->types[literal_split->num_blocks] =
                 (uint8_t)*(undefined4 *)
                           ((long)pvVar4 +
                           (ulong)literal_split_decoder->types[*cur_block_decoder] * 4);
            literal_split->lengths[literal_split->num_blocks] = (uint32_t)types_mapping;
            bVar2 = (byte)literal_split->num_types;
            bVar3 = literal_split->types[literal_split->num_blocks] + 1;
            if (bVar3 < bVar2) {
              bVar3 = bVar2;
            }
            literal_split->num_types = (ulong)bVar3;
            literal_split->num_blocks = literal_split->num_blocks + 1;
          }
          else {
            lVar5 = literal_split->num_blocks - 1;
            literal_split->lengths[lVar5] = literal_split->lengths[lVar5] + (uint32_t)types_mapping;
          }
          types_mapping = (int *)0x0;
        }
        *cur_block_decoder = *cur_block_decoder + 1;
      }
      else {
        types_mapping = (int *)((ulong)cmds[local_90].insert_len_ + (long)types_mapping);
        cur_length = (cmds[local_90].insert_len_ + (cmds[local_90].copy_len_ & 0x1ffffff)) +
                     cur_length;
        local_90 = local_90 + 1;
      }
    }
  }
  if (types_mapping != (int *)0x0) {
    if (*(int *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4) == -1)
    {
      *(int *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4) =
           (int)literal_split->num_types;
    }
    if ((literal_split->num_blocks == 0) ||
       (*(uint *)((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4) !=
        (uint)literal_split->types[literal_split->num_blocks - 1])) {
      literal_split->types[literal_split->num_blocks] =
           (uint8_t)*(undefined4 *)
                     ((long)pvVar4 + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4);
      literal_split->lengths[literal_split->num_blocks] = uVar1;
      bVar2 = (byte)literal_split->num_types;
      bVar3 = literal_split->types[literal_split->num_blocks] + 1;
      if (bVar3 < bVar2) {
        bVar3 = bVar2;
      }
      literal_split->num_types = (ulong)bVar3;
      literal_split->num_blocks = literal_split->num_blocks + 1;
    }
    else {
      lVar5 = literal_split->num_blocks - 1;
      literal_split->lengths[lVar5] = literal_split->lengths[lVar5] + uVar1;
    }
  }
  return;
}

Assistant:

void BrotliSplitBlockLiteralsFromStored(
                            MemoryManager* m,
                            const Command* cmds,
                            const size_t num_commands,
                            const size_t pos,
                            const size_t mask,
                            BlockSplit* literal_split,
                            const BlockSplitFromDecoder* literal_split_decoder,
                            size_t* cur_block_decoder) {
  BROTLI_ENSURE_CAPACITY(
      m, uint8_t, literal_split->types, literal_split->types_alloc_size,
      literal_split_decoder->num_blocks);
  BROTLI_ENSURE_CAPACITY(
      m, uint32_t, literal_split->lengths, literal_split->lengths_alloc_size,
      literal_split_decoder->num_blocks);
  size_t cur_pos = pos;
  literal_split->num_blocks = 0;
  literal_split->num_types = 0;
  size_t cur_length = 0;
  /* Mapping of the types from decoder (they increase with each metablock)
     to the appropriate types */
  int* types_mapping = (int*)malloc(sizeof(int) *
                                            literal_split_decoder->num_types);
  for (int i = 0; i < literal_split_decoder->num_types; ++i) {
    types_mapping[i] = -1;
  }

  int i = 0;
  while (i < num_commands) {
    /* Considering an interval of literals for current command:
       from cur_pos to cur_pos + insert_len*/

    /* If current literals interval lies after the current block
      that means we've finished the current block.
      If some literals have fallen inside current block before
      then need to save it*/
    if (cur_pos >= literal_split_decoder->positions_end[*cur_block_decoder]) {
      if (cur_length > 0) {
        /* If we haven't seen this decoder block type before
          then save a mapping of it to a current num_types */
        if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
          types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                      literal_split->num_types;
        }
        /* If the same block type as for a previous block then merge them */
        if (literal_split->num_blocks > 0 &&
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
              literal_split->types[literal_split->num_blocks - 1]) {
          literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
        } else {
          /* Map the decoder block type to an appropriate type */
          literal_split->types[literal_split->num_blocks] =
              types_mapping[literal_split_decoder->types[*cur_block_decoder]];
          literal_split->lengths[literal_split->num_blocks] = cur_length;
          literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                            literal_split->types[literal_split->num_blocks] + 1);
          literal_split->num_blocks++;
        }
        cur_length = 0;
      }
      (*cur_block_decoder)++;

    }
    /* Go through decoder blocks until a block with cur_pos inside is found */
    while (cur_pos >= literal_split_decoder->positions_end[*cur_block_decoder]) {
      (*cur_block_decoder)++;
    }
    /* Means that the first part of literals interval is already saved
       as a part of the previous block,
       now only need to look at the second part */
    if (cur_pos < literal_split_decoder->positions_begin[*cur_block_decoder]) {
      /* If literals interval ends inside the current block
         then increase an amount of literals for the current block */
      if (cur_pos + cmds[i].insert_len_ <=
                  literal_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length += cur_pos + cmds[i].insert_len_ -
                  literal_split_decoder->positions_begin[*cur_block_decoder];
        cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
        i++;
      }
      /* If literals interval ends after the current block
         then we've finished the block and need to save it */
      else {
        cur_length += literal_split_decoder->positions_end[*cur_block_decoder] -
                      literal_split_decoder->positions_begin[*cur_block_decoder];
        if (cur_length > 0) {
          if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
          }
          /* If the same block type as for a previous block then merge them */
          if (literal_split->num_blocks > 0 &&
              types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
                literal_split->types[literal_split->num_blocks - 1]) {
            literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
          } else {
            literal_split->types[literal_split->num_blocks] =
                types_mapping[literal_split_decoder->types[*cur_block_decoder]];
            literal_split->lengths[literal_split->num_blocks] = cur_length;
            literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
            literal_split->num_blocks++;
          }
          cur_length = 0;
        }
        (*cur_block_decoder)++;
      }
    }
    /* If literals interval starts inside the current block
       then look where it ends*/
    else if (cur_pos < literal_split_decoder->positions_end[*cur_block_decoder]) {
      /* If literals interval ends inside the current block
         then increase an amount of literals for the current block */
      if (cur_pos + cmds[i].insert_len_ <=
                literal_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length += cmds[i].insert_len_;
        cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
        i++;
      }
      /* If literals interval ends after the current block
         then we've finished the block and need to save it */
      else {
        cur_length += literal_split_decoder->positions_end[*cur_block_decoder]
                                                                      - cur_pos;
        if (cur_length > 0) {
          if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
          }
          /* If the same block type as for a previous block then merge them */
          if (literal_split->num_blocks > 0 &&
              types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
                literal_split->types[literal_split->num_blocks - 1]) {
            literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
          } else {
            literal_split->types[literal_split->num_blocks] =
                    types_mapping[literal_split_decoder->types[*cur_block_decoder]];
            literal_split->lengths[literal_split->num_blocks] = cur_length;
            literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
            literal_split->num_blocks++;
          }
          cur_length = 0;
        }
        (*cur_block_decoder)++;
      }
    }
  }
  /* Save the last in metablock block */
  if (cur_length > 0) {
    if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
      types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
    }
    /* If the same block type as for a previous block then merge them */
    if (literal_split->num_blocks > 0 &&
        types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
          literal_split->types[literal_split->num_blocks - 1]) {
      literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
    } else {
      literal_split->types[literal_split->num_blocks] =
                  types_mapping[literal_split_decoder->types[*cur_block_decoder]];
      literal_split->lengths[literal_split->num_blocks] = cur_length;
      literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
      literal_split->num_blocks++;
    }
  }
}